

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ptc::osout<char,std::__cxx11::string,char[15]>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,ptc *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          char (*args_1) [15])

{
  basic_streambuf<char,_std::char_traits<char>_> *sbuf_00;
  ostream *poVar1;
  Print<char> printer;
  savebuf<char> sbuf;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_298;
  undefined1 local_278 [104];
  undefined1 local_210 [104];
  ostream local_1a8;
  
  Print<char>::Print((Print<char> *)local_278);
  sbuf_00 = *(basic_streambuf<char,_std::char_traits<char>_> **)
             (std::__cxx11::wstringbuf::str + *(long *)(std::cout + -0x18));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  savebuf<char>::savebuf((savebuf<char> *)local_210,sbuf_00);
  std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  poVar1 = std::operator<<(&local_1a8,(string *)this);
  std::operator<<(poVar1,(string *)(local_278 + 0x20));
  poVar1 = std::operator<<(&local_1a8,(char *)args);
  std::operator<<(poVar1,(string *)(local_278 + 0x20));
  std::__cxx11::stringbuf::str();
  Print<char>::print_backend<std::ostream&,std::__cxx11::string>
            ((Print<char> *)local_278,(basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
             &bStack_298);
  std::__cxx11::string::~string((string *)&bStack_298);
  std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_210 + 0x48));
  savebuf<char>::~savebuf((savebuf<char> *)local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  Print<char>::~Print((Print<char> *)local_278);
  return __return_storage_ptr__;
}

Assistant:

inline const std::basic_string<T> osout( const Args&... args )
   {
    Print<T> printer;
    std::basic_streambuf<T>* buf = select_cout<T>::cout.rdbuf();
    std::basic_ostringstream<T> str;

    savebuf<T> sbuf( buf );
    select_cout<T>::cout.rdbuf( &sbuf );

    ( ( str << args << printer.getSep() ), ... );
    printer( select_cout<T>::cout, str.str() );
    select_cout<T>::cout.rdbuf( buf );
    return sbuf.str();
   }